

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

size_t HTS_ftell(HTS_File *fp)

{
  char *in_RDI;
  HTS_Data *d;
  fpos_t pos;
  fpos_t local_20;
  size_t local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = 0;
  }
  else if (*in_RDI == '\0') {
    fgetpos(*(FILE **)(in_RDI + 8),&local_20);
    local_8 = local_20.__pos;
  }
  else if (*in_RDI == '\x01') {
    local_8 = *(size_t *)(*(long *)(in_RDI + 8) + 0x10);
  }
  else {
    HTS_error(0,"HTS_ftell: Unknown file type.\n");
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t HTS_ftell(HTS_File * fp)
{
   if (fp == NULL) {
      return 0;
   } else if (fp->type == HTS_FILE) {
      fpos_t pos;
      fgetpos((FILE *) fp->pointer, &pos);
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__APPLE__) || defined(__ANDROID__)
      return (size_t) pos;
#else
      return (size_t) pos.__pos;
#endif                          /* _WIN32 || __CYGWIN__ || __APPLE__ || __ANDROID__ */
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      return d->index;
   }
   HTS_error(0, "HTS_ftell: Unknown file type.\n");
   return 0;
}